

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O2

VarId __thiscall
optimization::global_var_to_local::get_new_id(global_var_to_local *this,MirFunction *f,Variable *v)

{
  int iVar1;
  long lVar2;
  undefined8 extraout_RDX;
  VarId VVar3;
  pair<const_unsigned_int,_mir::inst::Variable> pStack_48;
  
  lVar2 = std::_Rb_tree_decrement(&(f->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  iVar1 = *(int *)(lVar2 + 0x20);
  *(undefined ***)this = &PTR_display_001d90d0;
  *(int *)(this + 8) = iVar1 + 1;
  std::pair<const_unsigned_int,_mir::inst::Variable>::
  pair<unsigned_int_&,_mir::inst::Variable_&,_true>(&pStack_48,(uint *)(this + 8),v);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::_M_insert_unique<std::pair<unsigned_int_const,mir::inst::Variable>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
              *)&f->variables,&pStack_48);
  mir::inst::Variable::~Variable(&pStack_48.second);
  VVar3._8_8_ = extraout_RDX;
  VVar3.super_Displayable._vptr_Displayable = (_func_int **)this;
  return VVar3;
}

Assistant:

mir::inst::VarId get_new_id(mir::inst::MirFunction& f, mir::inst::Variable v) {
  auto end = f.variables.end();
  end--;
  auto id = mir::inst::VarId(end->first + 1);
  f.variables.insert({id.id, v});
  return id;
}